

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsWindowsPELinker::ScanDependencies
          (cmBinUtilsWindowsPELinker *this,string *file,TargetType param_2)

{
  long *plVar1;
  cmRuntimeDependencyArchive *this_00;
  char *pcVar2;
  _Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *p_Var3;
  bool bVar4;
  int iVar5;
  pointer pWVar6;
  ulong uVar7;
  pointer __result;
  allocator<WinPEDependency> *paVar8;
  ulong uVar9;
  WinPEDependency *__args;
  WinPEDependency *__args_00;
  ulong uVar10;
  _Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *p_Var11;
  string *__n;
  WinPEDependency *pWVar12;
  pointer pbVar13;
  WinPEDependency *__first;
  pointer pWVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  bool resolved;
  bool unique;
  string path;
  string origin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  needed;
  bool local_11a;
  bool local_119;
  vector<WinPEDependency,_std::allocator<WinPEDependency>_> local_118;
  string local_f8;
  cmBinUtilsWindowsPELinker *local_d8;
  pointer local_d0;
  pointer local_c8;
  WinPEDependency local_c0;
  allocator_type *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *local_60;
  WinPEDependency *local_58;
  _Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = file;
  local_d8 = this;
  iVar5 = (*((this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>.
            _M_head_impl)->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[2])();
  if ((char)iVar5 == '\0') {
    bVar4 = false;
  }
  else {
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var11 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
              ((long)local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    paVar8 = (allocator<WinPEDependency> *)((ulong)p_Var11 >> 0x39);
    if (paVar8 != (allocator<WinPEDependency> *)0x0) {
      std::__throw_length_error("vector::reserve");
    }
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pWVar6 = std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::_M_allocate
                         (p_Var11,(size_t)__n);
      std::
      __uninitialized_copy_a<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency_const*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                ((WinPEDependency *)0x0,(WinPEDependency *)0x0,pWVar6,paVar8);
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pWVar6 + (long)p_Var11;
      p_Var11 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                ((long)local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_finish = pWVar6;
    }
    pbVar13 = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __first = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pWVar6 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    pWVar14 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_60 = file;
    if (0 < (long)p_Var11) {
      do {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_c0.Original._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
        paVar15 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.Original._M_dataplus._M_p == paVar15) {
          local_f8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
          local_c0.Original._M_string_length = pbVar13->_M_string_length;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
LAB_00631fbf:
          local_c0.Original.field_2._8_8_ = local_f8.field_2._8_8_;
          local_c0.Original._M_dataplus._M_p = (pointer)&local_c0.Original.field_2;
        }
        else {
          local_f8.field_2._M_allocated_capacity = (pbVar13->field_2)._M_allocated_capacity;
          local_c0.Original._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          if (local_c0.Original._M_dataplus._M_p == local_f8._M_dataplus._M_p) goto LAB_00631fbf;
        }
        local_c0.Original.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_allocated_capacity =
             local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pWVar12 = &local_c0;
        cmsys::SystemTools::LowerCase(&local_c0.LowerCase,&pWVar12->Original);
        local_50 = p_Var11;
        if (pWVar14 == pWVar6) {
          uVar10 = (long)pWVar6 - (long)__first;
          if (uVar10 == 0x7fffffffffffffc0) {
            local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
            super__Vector_impl_data._M_start = __first;
            local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
            super__Vector_impl_data._M_finish = pWVar14;
            local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pWVar6;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar7 = (long)uVar10 >> 6;
          uVar9 = uVar7;
          if (pWVar6 == __first) {
            uVar9 = 1;
          }
          p_Var11 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                    (uVar9 + uVar7);
          if ((_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)0x1fffffffffffffe <
              p_Var11) {
            p_Var11 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                      0x1ffffffffffffff;
          }
          paVar8 = (allocator<WinPEDependency> *)(uVar9 + uVar7);
          if (CARRY8(uVar9,uVar7)) {
            p_Var11 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                      0x1ffffffffffffff;
          }
          __result = std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::
                     _M_allocate(p_Var11,(size_t)pWVar12);
          local_80 = (allocator_type *)((long)__result + uVar10);
          local_d0 = pWVar6;
          local_c8 = __result;
          std::
          allocator_traits<std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>
          ::
          construct<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                    (local_80,&local_c0,__args_00);
          local_58 = std::
                     __uninitialized_copy_a<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency_const*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                               (__first,pWVar14,__result,paVar8);
          pWVar6 = local_d0;
          if (local_d0 != __first) {
            paVar15 = &(__first->LowerCase).field_2;
            do {
              plVar1 = (long *)(((string *)(paVar15 + -1))->_M_dataplus)._M_p;
              if (paVar15 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
                operator_delete(plVar1,paVar15->_M_allocated_capacity + 1);
              }
              if (paVar15 + -2 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar15[-3]._M_allocated_capacity) {
                operator_delete((long *)paVar15[-3]._M_allocated_capacity,
                                paVar15[-2]._M_allocated_capacity + 1);
              }
              pWVar14 = (pointer)(paVar15 + 1);
              paVar15 = paVar15 + 4;
            } while (pWVar14 != pWVar6);
          }
          if (__first != (WinPEDependency *)0x0) {
            operator_delete(__first,uVar10);
          }
          pWVar6 = local_c8 + (long)p_Var11;
          __first = local_c8;
          pWVar12 = local_58;
        }
        else {
          std::
          allocator_traits<std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>
          ::
          construct<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                    ((allocator_type *)pWVar14,&local_c0,__args);
          pWVar12 = pWVar14;
        }
        p_Var3 = local_50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.LowerCase._M_dataplus._M_p != &local_c0.LowerCase.field_2) {
          operator_delete(local_c0.LowerCase._M_dataplus._M_p,
                          local_c0.LowerCase.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.Original._M_dataplus._M_p != &local_c0.Original.field_2) {
          operator_delete(local_c0.Original._M_dataplus._M_p,
                          local_c0.Original.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        p_Var11 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                  ((long)&p_Var3[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        pbVar13 = pbVar13 + 1;
        pWVar14 = pWVar12 + 1;
      } while (1 < (long)p_Var3);
    }
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pWVar6;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_finish = pWVar14;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_start = __first;
    pWVar14 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pWVar6 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_start;
    cmsys::SystemTools::GetFilenamePath(&local_c0.Original,local_60);
    bVar4 = true;
    if (pWVar6 != pWVar14) {
      do {
        bVar4 = cmRuntimeDependencyArchive::IsPreExcluded
                          ((local_d8->super_cmBinUtilsLinker).Archive,&pWVar6->LowerCase);
        if (!bVar4) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_allocated_capacity =
               local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_11a = false;
          ResolveDependency(local_d8,&pWVar6->LowerCase,&local_c0.Original,&local_f8,&local_11a);
          this_00 = (local_d8->super_cmBinUtilsLinker).Archive;
          if (local_11a == true) {
            bVar4 = cmRuntimeDependencyArchive::IsPostExcluded(this_00,&local_f8);
            if (!bVar4) {
              pcVar2 = (char *)(pWVar6->Original)._M_string_length;
              std::__cxx11::string::replace
                        ((ulong)&local_f8,local_f8._M_string_length - (long)pcVar2,pcVar2,
                         (ulong)(pWVar6->Original)._M_dataplus._M_p);
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmRuntimeDependencyArchive::AddResolvedPath
                        ((local_d8->super_cmBinUtilsLinker).Archive,&pWVar6->Original,&local_f8,
                         &local_119,&local_48);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if ((local_119 == true) &&
                 (iVar5 = (*(local_d8->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker[3])
                                    (local_d8,&local_f8,2), (char)iVar5 == '\0')) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                bVar4 = false;
                goto LAB_00632303;
              }
            }
          }
          else {
            cmRuntimeDependencyArchive::AddUnresolvedPath(this_00,&pWVar6->Original);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        pWVar6 = pWVar6 + 1;
      } while (pWVar6 != pWVar14);
      bVar4 = true;
    }
LAB_00632303:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.Original._M_dataplus._M_p != &local_c0.Original.field_2) {
      operator_delete(local_c0.Original._M_dataplus._M_p,
                      local_c0.Original.field_2._M_allocated_capacity + 1);
    }
    std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::~vector(&local_118);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return bVar4;
}

Assistant:

bool cmBinUtilsWindowsPELinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> needed;
  if (!this->Tool->GetFileInfo(file, needed)) {
    return false;
  }

  struct WinPEDependency
  {
    WinPEDependency(std::string o)
      : Original(std::move(o))
      , LowerCase(cmSystemTools::LowerCase(Original))
    {
    }
    std::string const Original;
    std::string const LowerCase;
  };

  std::vector<WinPEDependency> depends;
  depends.reserve(needed.size());
  std::move(needed.begin(), needed.end(), std::back_inserter(depends));
  std::string origin = cmSystemTools::GetFilenamePath(file);

  for (auto const& lib : depends) {
    if (!this->Archive->IsPreExcluded(lib.LowerCase)) {
      std::string path;
      bool resolved = false;
      if (!this->ResolveDependency(lib.LowerCase, origin, path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path)) {
#ifdef _WIN32
          ReplaceWithActualNameCasing(path);
#else
          path.replace(path.end() - lib.Original.size(), path.end(),
                       lib.Original);
#endif
          bool unique;
          this->Archive->AddResolvedPath(lib.Original, path, unique);
          if (unique &&
              !this->ScanDependencies(path, cmStateEnums::SHARED_LIBRARY)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(lib.Original);
      }
    }
  }

  return true;
}